

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgloadr.c
# Opt level: O0

void FT_GlyphLoader_Reset(FT_GlyphLoader loader)

{
  FT_Memory memory_00;
  FT_Memory memory;
  FT_GlyphLoader loader_local;
  
  memory_00 = loader->memory;
  ft_mem_free(memory_00,(loader->base).outline.points);
  (loader->base).outline.points = (FT_Vector *)0x0;
  ft_mem_free(memory_00,(loader->base).outline.tags);
  (loader->base).outline.tags = (char *)0x0;
  ft_mem_free(memory_00,(loader->base).outline.contours);
  (loader->base).outline.contours = (short *)0x0;
  ft_mem_free(memory_00,(loader->base).extra_points);
  (loader->base).extra_points = (FT_Vector *)0x0;
  ft_mem_free(memory_00,(loader->base).subglyphs);
  (loader->base).subglyphs = (FT_SubGlyph)0x0;
  (loader->base).extra_points2 = (FT_Vector *)0x0;
  loader->max_points = 0;
  loader->max_contours = 0;
  loader->max_subglyphs = 0;
  FT_GlyphLoader_Rewind(loader);
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_GlyphLoader_Reset( FT_GlyphLoader  loader )
  {
    FT_Memory memory = loader->memory;


    FT_FREE( loader->base.outline.points );
    FT_FREE( loader->base.outline.tags );
    FT_FREE( loader->base.outline.contours );
    FT_FREE( loader->base.extra_points );
    FT_FREE( loader->base.subglyphs );

    loader->base.extra_points2 = NULL;

    loader->max_points    = 0;
    loader->max_contours  = 0;
    loader->max_subglyphs = 0;

    FT_GlyphLoader_Rewind( loader );
  }